

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzplane.cpp
# Opt level: O1

bool __thiscall TPZPlane::Belongs(TPZPlane *this,TPZVec<double> *ponto)

{
  long lVar1;
  double dVar2;
  
  dVar2 = 0.0;
  lVar1 = 0;
  do {
    dVar2 = dVar2 + ponto->fStore[lVar1] * (this->fCoef).fStore[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  return ABS(dVar2 + (this->fCoef).fStore[3]) < 9e-06;
}

Assistant:

bool TPZPlane::Belongs(const TPZVec<REAL> &ponto){
	REAL aux=0.0;
	int i;
	
	for(i=0;i<3;i++){
		aux = aux + ponto[i]*fCoef[i];
	}
	aux = aux + fCoef[3];
	if(fabs(aux)<0.000009) {
		return true;
	}
	else return false;
}